

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderBuiltinVarTests.cpp
# Opt level: O0

void __thiscall
vkt::sr::anon_unknown_1::BuiltinInputVariationsCaseInstance::setupDefaultInputs
          (BuiltinInputVariationsCaseInstance *this)

{
  undefined1 local_d8 [8];
  float colors [24];
  float vertices [24];
  BuiltinInputVariationsCaseInstance *this_local;
  
  memcpy(colors + 0x16,&DAT_0134a880,0x60);
  ShaderRenderCaseInstance::addAttribute
            (&this->super_ShaderRenderCaseInstance,0,VK_FORMAT_R32G32B32A32_SFLOAT,0x10,6,
             colors + 0x16);
  if ((this->m_shaderInputTypes & 2) != 0) {
    memcpy(local_d8,&DAT_0134a8e0,0x60);
    ShaderRenderCaseInstance::addAttribute
              (&this->super_ShaderRenderCaseInstance,1,VK_FORMAT_R32G32B32A32_SFLOAT,0x10,6,local_d8
              );
  }
  return;
}

Assistant:

void BuiltinInputVariationsCaseInstance::setupDefaultInputs (void)
{
	const float vertices[] =
	{
		-1.0f, -1.0f, 0.0f, 1.0f,
		 0.0f, -1.0f, 0.0f, 1.0f,
		 1.0f, -1.0f, 0.0f, 1.0f,
		 1.0f,  1.0f, 0.0f, 1.0f,
		 0.0f,  1.0f, 0.0f, 1.0f,
		-1.0f,  1.0f, 0.0f, 1.0f
	};

	addAttribute(0u, VK_FORMAT_R32G32B32A32_SFLOAT, deUint32(sizeof(float) * 4), 6, vertices);

	if (m_shaderInputTypes & SHADER_INPUT_VARYING_BIT)
	{
		const float colors[] =
		{
			 0.6f,  0.0f, 0.0f, 1.0f,
			 0.3f,  0.3f, 0.0f, 1.0f,
			 0.0f,  0.6f, 0.0f, 1.0f,
			 0.0f,  0.6f, 0.0f, 1.0f,
			 0.3f,  0.3f, 0.0f, 1.0f,
			 0.6f,  0.0f, 0.0f, 1.0f
		};
		addAttribute(1u, VK_FORMAT_R32G32B32A32_SFLOAT, deUint32(sizeof(float) * 4), 6, colors);
	}
}